

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ListBox(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter
                   ,void *data,int items_count,int height_in_items)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  undefined8 in_RCX;
  code *in_RDX;
  int *in_RSI;
  int in_R8D;
  float items_height;
  ImVec2 *in_stack_00000018;
  ImGuiSelectableFlags in_stack_00000020;
  bool in_stack_00000027;
  char *in_stack_00000028;
  char *item_text;
  bool item_selected;
  int i;
  ImGuiListClipper clipper;
  bool value_changed;
  ImGuiContext *g;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff74;
  byte in_stack_ffffffffffffff75;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  int iVar4;
  ImVec2 local_80;
  char *local_78;
  byte local_69;
  int local_68;
  ImGuiListClipper local_54;
  byte local_39;
  ImGuiContext *local_38;
  int local_2c;
  undefined8 local_28;
  code *local_20;
  int *local_18;
  byte local_1;
  
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = ListBoxHeader((char *)CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                        (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                        (int)in_stack_ffffffffffffff68);
  if (bVar1) {
    local_38 = GImGui;
    local_39 = 0;
    ImGuiListClipper::ImGuiListClipper
              ((ImGuiListClipper *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    items_height = GetTextLineHeightWithSpacing();
    ImGuiListClipper::Begin(&local_54,local_2c,items_height);
    iVar4 = local_2c;
    while (uVar2 = ImGuiListClipper::Step((ImGuiListClipper *)CONCAT44(items_height,iVar4)),
          (bool)uVar2) {
      for (local_68 = local_54.DisplayStart; local_68 < local_54.DisplayEnd; local_68 = local_68 + 1
          ) {
        local_69 = local_68 == *local_18;
        bVar3 = (*local_20)(local_28,local_68,&local_78);
        if ((bVar3 & 1) == 0) {
          local_78 = "*Unknown item*";
        }
        PushID(CONCAT13(uVar2,CONCAT12(bVar3,CONCAT11(in_stack_ffffffffffffff75,
                                                      in_stack_ffffffffffffff74))));
        in_stack_ffffffffffffff75 = local_69;
        ImVec2::ImVec2(&local_80,0.0,0.0);
        bVar1 = Selectable(in_stack_00000028,in_stack_00000027,in_stack_00000020,in_stack_00000018);
        if (bVar1) {
          *local_18 = local_68;
          local_39 = 1;
        }
        if ((local_69 & 1) != 0) {
          SetItemDefaultFocus();
        }
        PopID();
      }
    }
    ListBoxFooter();
    if ((local_39 & 1) != 0) {
      MarkItemEdited((local_38->CurrentWindow->DC).LastItemId);
    }
    local_1 = local_39 & 1;
    ImGuiListClipper::~ImGuiListClipper(&local_54);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ImGui::ListBox(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int height_in_items)
{
    if (!ListBoxHeader(label, items_count, height_in_items))
        return false;

    // Assume all items have even height (= 1 line of text). If you need items of different or variable sizes you can create a custom version of ListBox() in your code without using the clipper.
    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    ImGuiListClipper clipper;
    clipper.Begin(items_count, GetTextLineHeightWithSpacing()); // We know exactly our line height here so we pass it as a minor optimization, but generally you don't need to.
    while (clipper.Step())
        for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
        {
            const bool item_selected = (i == *current_item);
            const char* item_text;
            if (!items_getter(data, i, &item_text))
                item_text = "*Unknown item*";

            PushID(i);
            if (Selectable(item_text, item_selected))
            {
                *current_item = i;
                value_changed = true;
            }
            if (item_selected)
                SetItemDefaultFocus();
            PopID();
        }
    ListBoxFooter();
    if (value_changed)
        MarkItemEdited(g.CurrentWindow->DC.LastItemId);

    return value_changed;
}